

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)18>_> *
vkt::synchronization::makeComputePipeline
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkPipelineLayout pipelineLayout,VkShaderModule shaderModule,
          VkSpecializationInfo *specInfo,PipelineCacheData *pipelineCacheData)

{
  Handle<(vk::HandleType)15> pipelineCache;
  Move<vk::Handle<(vk::HandleType)18>_> *pipeline;
  RefBase<vk::Handle<(vk::HandleType)15>_> local_d8;
  RefBase<vk::Handle<(vk::HandleType)15>_> local_b8;
  VkComputePipelineCreateInfo local_90;
  
  local_90.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  local_90.pNext = (void *)0x0;
  local_90.flags = 0;
  local_90.stage.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  local_90.stage.pNext = (void *)0x0;
  local_90.stage.flags = 0;
  local_90.stage.stage = VK_SHADER_STAGE_COMPUTE_BIT;
  local_90.stage.pName = "main";
  local_90.basePipelineHandle.m_internal = 0;
  local_90.basePipelineIndex = 0;
  local_90.stage.module.m_internal = shaderModule.m_internal;
  local_90.stage.pSpecializationInfo = specInfo;
  local_90.layout.m_internal = pipelineLayout.m_internal;
  PipelineCacheData::createPipelineCache
            ((Move<vk::Handle<(vk::HandleType)15>_> *)&local_b8,pipelineCacheData,vk,device);
  local_d8.m_data.deleter.m_device = local_b8.m_data.deleter.m_device;
  local_d8.m_data.deleter.m_allocator = local_b8.m_data.deleter.m_allocator;
  local_d8.m_data.object.m_internal = local_b8.m_data.object.m_internal;
  local_d8.m_data.deleter.m_deviceIface = local_b8.m_data.deleter.m_deviceIface;
  local_b8.m_data.object.m_internal = 0;
  local_b8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_b8.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::~RefBase(&local_b8);
  pipelineCache.m_internal = local_d8.m_data.object.m_internal;
  ::vk::createComputePipeline
            (__return_storage_ptr__,vk,device,(VkPipelineCache)local_d8.m_data.object.m_internal,
             &local_90,(VkAllocationCallbacks *)0x0);
  PipelineCacheData::setFromPipelineCache
            (pipelineCacheData,vk,device,(VkPipelineCache)pipelineCache.m_internal);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::~RefBase(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipeline> makeComputePipeline (const DeviceInterface&		vk,
									  const VkDevice				device,
									  const VkPipelineLayout		pipelineLayout,
									  const VkShaderModule			shaderModule,
									  const VkSpecializationInfo*	specInfo,
									  PipelineCacheData&			pipelineCacheData)
{
	const VkPipelineShaderStageCreateInfo shaderStageInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType					sType;
		DE_NULL,												// const void*						pNext;
		(VkPipelineShaderStageCreateFlags)0,					// VkPipelineShaderStageCreateFlags	flags;
		VK_SHADER_STAGE_COMPUTE_BIT,							// VkShaderStageFlagBits			stage;
		shaderModule,											// VkShaderModule					module;
		"main",													// const char*						pName;
		specInfo,												// const VkSpecializationInfo*		pSpecializationInfo;
	};
	const VkComputePipelineCreateInfo pipelineInfo =
	{
		VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,		// VkStructureType					sType;
		DE_NULL,											// const void*						pNext;
		(VkPipelineCreateFlags)0,							// VkPipelineCreateFlags			flags;
		shaderStageInfo,									// VkPipelineShaderStageCreateInfo	stage;
		pipelineLayout,										// VkPipelineLayout					layout;
		DE_NULL,											// VkPipeline						basePipelineHandle;
		0,													// deInt32							basePipelineIndex;
	};

	{
		const vk::Unique<vk::VkPipelineCache>	pipelineCache	(pipelineCacheData.createPipelineCache(vk, device));
		vk::Move<vk::VkPipeline>				pipeline		(createComputePipeline(vk, device, *pipelineCache, &pipelineInfo));

		// Refresh data from cache
		pipelineCacheData.setFromPipelineCache(vk, device, *pipelineCache);

		return pipeline;
	}
}